

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::Init(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
       *this)

{
  Arena *this_00;
  InnerMap *this_01;
  
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    this_01 = (InnerMap *)operator_new(0x30);
    InnerMap::InnerMap(this_01,(Arena *)0x0,0);
  }
  else {
    Arena::AllocHook(this_00,(type_info *)
                             &Map<std::__cxx11::string,google::protobuf::Value>::InnerMap::typeinfo,
                     0x30);
    this_01 = (InnerMap *)Arena::AllocateAlignedNoHook(this_00,0x30);
    InnerMap::InnerMap(this_01,this_00,0);
  }
  this->elements_ = this_01;
  return;
}

Assistant:

void Init() { elements_ = Arena::CreateMessage<InnerMap>(arena_, 0u); }